

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinematic_chain.c
# Opt level: O1

void rev_project_wrench(kcc_joint *joint,mc_abi *m,mc_wrench *f,mc_wrench *r,int count)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  
  if (joint == (kcc_joint *)0x0) {
    __assert_fail("joint",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x197,
                  "void rev_project_wrench(const struct kcc_joint *, const struct mc_abi *, const struct mc_wrench *, struct mc_wrench *, int)"
                 );
  }
  if (m == (mc_abi *)0x0) {
    __assert_fail("m",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x198,
                  "void rev_project_wrench(const struct kcc_joint *, const struct mc_abi *, const struct mc_wrench *, struct mc_wrench *, int)"
                 );
  }
  if (f == (mc_wrench *)0x0) {
    __assert_fail("f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x199,
                  "void rev_project_wrench(const struct kcc_joint *, const struct mc_abi *, const struct mc_wrench *, struct mc_wrench *, int)"
                 );
  }
  if (r != (mc_wrench *)0x0) {
    if (f == r) {
      __assert_fail("f != r",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                    ,0x19b,
                    "void rev_project_wrench(const struct kcc_joint *, const struct mc_abi *, const struct mc_wrench *, struct mc_wrench *, int)"
                   );
    }
    lVar1 = (long)(int)(joint->field_1).revolute_joint.axis;
    dVar6 = *(double *)((long)&(m->second_moment_of_mass).field_0 + lVar1 * 0x20) +
            *(joint->field_1).revolute_joint.inertia;
    if ((dVar6 == 0.0) && (!NAN(dVar6))) {
      __assert_fail("d != 0.0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                    ,0x1a1,
                    "void rev_project_wrench(const struct kcc_joint *, const struct mc_abi *, const struct mc_wrench *, struct mc_wrench *, int)"
                   );
    }
    if (0 < count) {
      lVar3 = 0;
      uVar4 = 0;
      do {
        dVar7 = f->torque[uVar4].field_0.data[lVar1] / dVar6;
        lVar2 = 0;
        pdVar5 = (double *)((long)&(m->second_moment_of_mass).field_0 + lVar1 * 8);
        do {
          *(double *)((long)&r->torque->field_0 + lVar2 + lVar3) =
               *(double *)((long)&f->torque->field_0 + lVar2 + lVar3) - *pdVar5 * dVar7;
          *(double *)((long)&r->force->field_0 + lVar2 + lVar3) =
               *(double *)((long)&f->force->field_0 + lVar2 + lVar3) -
               *(double *)((long)&(m->first_moment_of_mass).field_0 + lVar2 + lVar1 * 0x18) * dVar7;
          lVar2 = lVar2 + 8;
          pdVar5 = pdVar5 + 3;
        } while (lVar2 != 0x18);
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x18;
      } while (uVar4 != (uint)count);
    }
    return;
  }
  __assert_fail("r",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                ,0x19a,
                "void rev_project_wrench(const struct kcc_joint *, const struct mc_abi *, const struct mc_wrench *, struct mc_wrench *, int)"
               );
}

Assistant:

static void rev_project_wrench(
        const struct kcc_joint *joint,
        const struct mc_abi *m,
        const struct mc_wrench *f,
        struct mc_wrench *r,
        int count)
{
    assert(joint);
    assert(m);
    assert(f);
    assert(r);
    assert(f != r);

    int k = joint->revolute_joint.axis;

    double d = m->second_moment_of_mass.row[k].data[k]
            + joint->revolute_joint.inertia[0];
    assert(d != 0.0);

    for (int j = 0; j < count; j++) {
        double qdd = f->torque[j].data[k] / d;

        for (int i = 0; i < 3; i++) {
            double m2 = m->second_moment_of_mass.row[i].data[k];
            r->torque[j].data[i] = f->torque[j].data[i] - (m2 * qdd);

            double m1 = m->first_moment_of_mass.row[k].data[i];               // consider transpose, thus [k, i]
            r->force[j].data[i] = f->force[j].data[i]- (m1 * qdd);
        }
    }
}